

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86.cpp
# Opt level: O1

int __thiscall
ncnn::BatchNorm_x86::forward_inplace(BatchNorm_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  uint uVar8;
  float *pfVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  float *pfVar14;
  ulong uVar15;
  uint uVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  
  iVar3 = bottom_top_blob->elempack;
  iVar11 = bottom_top_blob->dims;
  iVar4 = bottom_top_blob->w;
  uVar8 = bottom_top_blob->h;
  iVar5 = bottom_top_blob->d;
  uVar6 = bottom_top_blob->c;
  if (iVar11 == 2) {
    if (0 < (int)uVar8) {
      uVar10 = iVar3 * iVar4;
      uVar15 = 0;
      do {
        pvVar7 = (this->super_BatchNorm).a_data.data;
        fVar1 = *(float *)((long)pvVar7 + uVar15 * 4);
        fVar18 = fVar1;
        fVar19 = fVar1;
        fVar20 = fVar1;
        fVar21 = fVar1;
        if (iVar3 == 4) {
          pfVar17 = (float *)((long)pvVar7 + uVar15 * 0x10);
          fVar18 = *pfVar17;
          fVar19 = pfVar17[1];
          fVar20 = pfVar17[2];
          fVar21 = pfVar17[3];
        }
        pvVar7 = (this->super_BatchNorm).b_data.data;
        fVar2 = *(float *)((long)pvVar7 + uVar15 * 4);
        fVar22 = fVar2;
        fVar23 = fVar2;
        fVar24 = fVar2;
        fVar25 = fVar2;
        if (iVar3 == 4) {
          pfVar17 = (float *)((long)pvVar7 + uVar15 * 0x10);
          fVar22 = *pfVar17;
          fVar23 = pfVar17[1];
          fVar24 = pfVar17[2];
          fVar25 = pfVar17[3];
        }
        pfVar17 = (float *)((long)bottom_top_blob->w * uVar15 * bottom_top_blob->elemsize +
                           (long)bottom_top_blob->data);
        uVar16 = 0;
        if (3 < (int)uVar10) {
          iVar12 = 3;
          do {
            *pfVar17 = *pfVar17 * fVar22 + fVar18;
            pfVar17[1] = pfVar17[1] * fVar23 + fVar19;
            pfVar17[2] = pfVar17[2] * fVar24 + fVar20;
            pfVar17[3] = pfVar17[3] * fVar25 + fVar21;
            pfVar17 = pfVar17 + 4;
            iVar12 = iVar12 + 4;
            uVar16 = uVar10 & 0xfffffffc;
          } while (iVar12 < (int)uVar10);
        }
        if (uVar10 - uVar16 != 0 && (int)uVar16 <= (int)uVar10) {
          lVar13 = 0;
          do {
            pfVar17[lVar13] = pfVar17[lVar13] * fVar2 + fVar1;
            lVar13 = lVar13 + 1;
          } while (uVar10 - uVar16 != (int)lVar13);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar8);
    }
  }
  else if (iVar11 == 1) {
    pfVar17 = (float *)bottom_top_blob->data;
    pfVar9 = (float *)(this->super_BatchNorm).a_data.data;
    pfVar14 = (float *)(this->super_BatchNorm).b_data.data;
    uVar16 = iVar3 * iVar4;
    uVar10 = 0;
    if (3 < (int)uVar16) {
      uVar10 = uVar16 & 0x7ffffffc;
      iVar12 = 3;
      do {
        fVar1 = pfVar9[1];
        fVar18 = pfVar9[2];
        fVar19 = pfVar9[3];
        fVar20 = pfVar14[1];
        fVar21 = pfVar14[2];
        fVar2 = pfVar14[3];
        *pfVar17 = *pfVar14 * *pfVar17 + *pfVar9;
        pfVar17[1] = fVar20 * pfVar17[1] + fVar1;
        pfVar17[2] = fVar21 * pfVar17[2] + fVar18;
        pfVar17[3] = fVar2 * pfVar17[3] + fVar19;
        pfVar17 = pfVar17 + 4;
        pfVar9 = pfVar9 + 4;
        pfVar14 = pfVar14 + 4;
        iVar12 = iVar12 + 4;
      } while (iVar12 < (int)uVar16);
    }
    if (uVar16 - uVar10 != 0 && (int)uVar10 <= (int)uVar16) {
      lVar13 = 0;
      do {
        pfVar17[lVar13] = pfVar17[lVar13] * pfVar14[lVar13] + pfVar9[lVar13];
        lVar13 = lVar13 + 1;
      } while (uVar16 - uVar10 != (int)lVar13);
    }
  }
  if ((iVar11 - 3U < 2) && (0 < (int)uVar6)) {
    uVar8 = iVar4 * iVar3 * uVar8 * iVar5;
    uVar15 = 0;
    do {
      pvVar7 = (this->super_BatchNorm).a_data.data;
      fVar1 = *(float *)((long)pvVar7 + uVar15 * 4);
      fVar18 = fVar1;
      fVar19 = fVar1;
      fVar20 = fVar1;
      fVar21 = fVar1;
      if (iVar3 == 4) {
        pfVar17 = (float *)((long)pvVar7 + uVar15 * 0x10);
        fVar18 = *pfVar17;
        fVar19 = pfVar17[1];
        fVar20 = pfVar17[2];
        fVar21 = pfVar17[3];
      }
      pvVar7 = (this->super_BatchNorm).b_data.data;
      fVar2 = *(float *)((long)pvVar7 + uVar15 * 4);
      fVar22 = fVar2;
      fVar23 = fVar2;
      fVar24 = fVar2;
      fVar25 = fVar2;
      if (iVar3 == 4) {
        pfVar17 = (float *)((long)pvVar7 + uVar15 * 0x10);
        fVar22 = *pfVar17;
        fVar23 = pfVar17[1];
        fVar24 = pfVar17[2];
        fVar25 = pfVar17[3];
      }
      pfVar17 = (float *)(bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      uVar10 = 0;
      if (3 < (int)uVar8) {
        iVar11 = 3;
        do {
          *pfVar17 = *pfVar17 * fVar22 + fVar18;
          pfVar17[1] = pfVar17[1] * fVar23 + fVar19;
          pfVar17[2] = pfVar17[2] * fVar24 + fVar20;
          pfVar17[3] = pfVar17[3] * fVar25 + fVar21;
          pfVar17 = pfVar17 + 4;
          iVar11 = iVar11 + 4;
          uVar10 = uVar8 & 0xfffffffc;
        } while (iVar11 < (int)uVar8);
      }
      if (uVar8 - uVar10 != 0 && (int)uVar10 <= (int)uVar8) {
        lVar13 = 0;
        do {
          pfVar17[lVar13] = pfVar17[lVar13] * fVar2 + fVar1;
          lVar13 = lVar13 + 1;
        } while (uVar8 - uVar10 != (int)lVar13);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar6);
  }
  return 0;
}

Assistant:

int BatchNorm_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int c = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        float* ptr = bottom_top_blob;
        const float* aptr = a_data;
        const float* bptr = b_data;

        const int size = w * elempack;

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p512 = _mm512_loadu_ps(ptr);
            __m512 _a512 = _mm512_loadu_ps(aptr);
            __m512 _b512 = _mm512_loadu_ps(bptr);
            _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
            _mm512_storeu_ps(ptr, _p512);
            ptr += 16;
            aptr += 16;
            bptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p256 = _mm256_loadu_ps(ptr);
            __m256 _a256 = _mm256_loadu_ps(aptr);
            __m256 _b256 = _mm256_loadu_ps(bptr);
            _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
            _mm256_storeu_ps(ptr, _p256);
            ptr += 8;
            aptr += 8;
            bptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p128 = _mm_loadu_ps(ptr);
            __m128 _a128 = _mm_loadu_ps(aptr);
            __m128 _b128 = _mm_loadu_ps(bptr);
            _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
            _mm_storeu_ps(ptr, _p128);
            ptr += 4;
            aptr += 4;
            bptr += 4;
        }
#endif // __SSE__
        for (; i < size; i++)
        {
            *ptr = *bptr * *ptr + *aptr;
            ptr++;
            aptr++;
            bptr++;
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float a = a_data[i];
            float b = b_data[i];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + i * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + i * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; j < size; j++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    if (dims == 3 || dims == 4)
    {
        const int size = w * h * d * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float a = a_data[q];
            float b = b_data[q];

#if __SSE2__
            __m128 _a128 = (elempack == 4) ? _mm_loadu_ps((const float*)a_data + q * 4) : _mm_set1_ps(a);
            __m128 _b128 = (elempack == 4) ? _mm_loadu_ps((const float*)b_data + q * 4) : _mm_set1_ps(b);
#if __AVX__
            __m256 _a256 = (elempack == 8) ? _mm256_loadu_ps((const float*)a_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a128), _a128, 1);
            __m256 _b256 = (elempack == 8) ? _mm256_loadu_ps((const float*)b_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b128), _b128, 1);
#if __AVX512F__
            __m512 _a512 = (elempack == 16) ? _mm512_loadu_ps((const float*)a_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_a256), _a256, 1);
            __m512 _b512 = (elempack == 16) ? _mm512_loadu_ps((const float*)b_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_b256), _b256, 1);
#endif // __AVX512F__
#endif // __AVX__
#endif // __SSE2__

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _p512 = _mm512_fmadd_ps(_p512, _b512, _a512);
                _mm512_storeu_ps(ptr, _p512);
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _p256 = _mm256_comp_fmadd_ps(_p256, _b256, _a256);
                _mm256_storeu_ps(ptr, _p256);
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _p128 = _mm_comp_fmadd_ps(_p128, _b128, _a128);
                _mm_storeu_ps(ptr, _p128);
                ptr += 4;
            }
#endif // __SSE__
            for (; i < size; i++)
            {
                *ptr = b * *ptr + a;
                ptr++;
            }
        }
    }

    return 0;
}